

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
InvariantBlockBackwardIterator::InvariantBlockBackwardIterator
          (InvariantBlockBackwardIterator *this,GlobOpt *globOpt,BasicBlock *exclusiveBeginBlock,
          BasicBlock *inclusiveEndBlock,StackSym *invariantSym,ValueNumber invariantSymValueNumber,
          bool followFlow)

{
  JitArenaAllocator *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  this->globOpt = globOpt;
  this->exclusiveEndBlock = inclusiveEndBlock->prev;
  this->invariantSym = invariantSym;
  this->invariantSymValueNumber = invariantSymValueNumber;
  this->block = exclusiveBeginBlock;
  pJVar1 = globOpt->tempAlloc;
  (this->blockBV).head = (Type_conflict)0x0;
  (this->blockBV).lastFoundIndex = (Type_conflict)0x0;
  (this->blockBV).alloc = pJVar1;
  (this->blockBV).lastUsedNodePrevNextField = &(this->blockBV).head;
  this->followFlow = followFlow;
  this->inclusiveEndBlock = inclusiveEndBlock;
  if (exclusiveBeginBlock == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3d0b,"(exclusiveBeginBlock)","exclusiveBeginBlock");
    if (!bVar3) goto LAB_0046fd2c;
    *puVar4 = 0;
  }
  if (inclusiveEndBlock == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3d0c,"(inclusiveEndBlock)","inclusiveEndBlock");
    if (!bVar3) goto LAB_0046fd2c;
    *puVar4 = 0;
  }
  if ((inclusiveEndBlock->field_0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3d0d,"(!inclusiveEndBlock->isDeleted)","!inclusiveEndBlock->isDeleted");
    if (!bVar3) goto LAB_0046fd2c;
    *puVar4 = 0;
  }
  if (exclusiveBeginBlock == inclusiveEndBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3d0e,"(exclusiveBeginBlock != inclusiveEndBlock)",
                       "exclusiveBeginBlock != inclusiveEndBlock");
    if (!bVar3) goto LAB_0046fd2c;
    *puVar4 = 0;
  }
  if ((invariantSymValueNumber != 0) == (invariantSym == (StackSym *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3d0f,"(!invariantSym == (invariantSymValueNumber == InvalidValueNumber))",
                       "!invariantSym == (invariantSymValueNumber == InvalidValueNumber)");
    if (!bVar3) {
LAB_0046fd2c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  MoveNext(this);
  return;
}

Assistant:

InvariantBlockBackwardIterator::InvariantBlockBackwardIterator(
    GlobOpt *const globOpt,
    BasicBlock *const exclusiveBeginBlock,
    BasicBlock *const inclusiveEndBlock,
    StackSym *const invariantSym,
    const ValueNumber invariantSymValueNumber,
    bool followFlow)
    : globOpt(globOpt),
    exclusiveEndBlock(inclusiveEndBlock->prev),
    invariantSym(invariantSym),
    invariantSymValueNumber(invariantSymValueNumber),
    block(exclusiveBeginBlock),
    blockBV(globOpt->tempAlloc),
    followFlow(followFlow)
#if DBG
    ,
    inclusiveEndBlock(inclusiveEndBlock)
#endif
{
    Assert(exclusiveBeginBlock);
    Assert(inclusiveEndBlock);
    Assert(!inclusiveEndBlock->isDeleted);
    Assert(exclusiveBeginBlock != inclusiveEndBlock);
    Assert(!invariantSym == (invariantSymValueNumber == InvalidValueNumber));

    MoveNext();
}